

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::makeCooperativeMatrixTypeKHR
          (Builder *this,Id component,Id scope,Id rows,Id cols,Id use)

{
  unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
  *this_00;
  pointer *ppuVar1;
  ulong uVar2;
  pointer puVar3;
  iterator __position;
  Id IVar4;
  uint uVar5;
  mapped_type *pmVar6;
  Instruction *pIVar7;
  vector<spv::Instruction*,std::allocator<spv::Instruction*>> *this_01;
  char *pcVar8;
  long *plVar9;
  undefined8 *puVar10;
  mapped_type_conflict *pmVar11;
  long *plVar12;
  long lVar13;
  Builder *pBVar14;
  _Bit_type *p_Var15;
  _Bit_type **pp_Var16;
  Instruction *type;
  anon_class_8_1_8991fb9c findName;
  string debugName;
  Instruction *local_f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  long lStack_d0;
  uint local_c4;
  uint local_c0;
  allocator<char> local_b9;
  _Bit_type **local_b8;
  undefined8 local_b0;
  _Bit_type *local_a8;
  undefined8 uStack_a0;
  Builder *local_98;
  _Head_base<0UL,_spv::Instruction_*,_false> local_90 [2];
  _func_int **local_80;
  _Bit_type **local_70;
  pointer local_68;
  _Bit_type *local_60 [2];
  _Bit_type **local_50;
  long local_48;
  _Bit_type *local_40 [2];
  
  this_00 = &this->groupedTypes;
  local_90[0]._M_head_impl._0_4_ = 0x1168;
  local_c4 = cols;
  local_c0 = rows;
  local_98 = this;
  pmVar6 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)local_90);
  if (0 < (int)((ulong)((long)(pmVar6->
                              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pmVar6->
                             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar13 = 0;
    do {
      local_90[0]._M_head_impl._0_4_ = 0x1168;
      pmVar6 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)local_90);
      local_f0 = (pmVar6->
                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar13];
      uVar2 = *(local_f0->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      if ((uVar2 & 1) == 0) {
LAB_00457d2c:
        __assert_fail("idOperand[op]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                      ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
      }
      puVar3 = (local_f0->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (*puVar3 == component) {
        if ((uVar2 & 2) == 0) goto LAB_00457d2c;
        if (puVar3[1] == scope) {
          if ((uVar2 & 4) == 0) goto LAB_00457d2c;
          if (puVar3[2] == local_c0) {
            if ((uVar2 & 8) == 0) goto LAB_00457d2c;
            if (puVar3[3] == local_c4) {
              if ((uVar2 & 0x10) == 0) goto LAB_00457d2c;
              if (puVar3[4] == use) goto LAB_00457d17;
            }
          }
        }
      }
      lVar13 = lVar13 + 1;
      local_90[0]._M_head_impl._0_4_ = 0x1168;
      pmVar6 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)local_90);
    } while (lVar13 < (int)((ulong)((long)(pmVar6->
                                          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pmVar6->
                                         super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  pIVar7 = (Instruction *)operator_new(0x60);
  pBVar14 = local_98;
  IVar4 = local_98->uniqueId + 1;
  local_98->uniqueId = IVar4;
  pIVar7->_vptr_Instruction = (_func_int **)&PTR__Instruction_00afab78;
  pIVar7->resultId = IVar4;
  pIVar7->typeId = 0;
  pIVar7->opCode = OpTypeCooperativeMatrixKHR;
  (pIVar7->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar7->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (pIVar7->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar7->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar7->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar7->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar7->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (pIVar7->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  pIVar7->block = (Block *)0x0;
  local_f0 = pIVar7;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&pIVar7->operands,5);
  if ((pIVar7->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage ==
      (pIVar7->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
    std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&pIVar7->idOperand,5);
  }
  Instruction::addIdOperand(local_f0,component);
  Instruction::addIdOperand(local_f0,scope);
  Instruction::addIdOperand(local_f0,local_c0);
  Instruction::addIdOperand(local_f0,local_c4);
  Instruction::addIdOperand(local_f0,use);
  local_90[0]._M_head_impl._0_4_ = 0x1168;
  this_01 = (vector<spv::Instruction*,std::allocator<spv::Instruction*>> *)
            std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)local_90);
  __position._M_current = *(Instruction ***)(this_01 + 8);
  if (__position._M_current == *(Instruction ***)(this_01 + 0x10)) {
    std::vector<spv::Instruction*,std::allocator<spv::Instruction*>>::
    _M_realloc_insert<spv::Instruction*const&>(this_01,__position,&local_f0);
  }
  else {
    *__position._M_current = local_f0;
    *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
  }
  local_90[0]._M_head_impl = local_f0;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar14->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)local_90);
  if (local_90[0]._M_head_impl != (Instruction *)0x0) {
    (*(local_90[0]._M_head_impl)->_vptr_Instruction[1])();
  }
  Module::mapInstruction(&pBVar14->module,local_f0);
  if (pBVar14->emitNonSemanticShaderDebugInfo != true) goto LAB_00457d17;
  local_90[0]._M_head_impl = (Instruction *)&local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"coopmat<","");
  pcVar8 = makeCooperativeMatrixTypeKHR::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)pBVar14,component);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,pcVar8,(allocator<char> *)&local_70);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  ppuVar1 = &local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  plVar12 = plVar9 + 2;
  if ((pointer *)*plVar9 == (pointer *)plVar12) {
    local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar12;
    lStack_d0 = plVar9[3];
    local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar1;
  }
  else {
    local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar12;
    local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*plVar9;
  }
  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)plVar9[1];
  *plVar9 = (long)plVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)local_90,
             (ulong)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  if ((pointer *)
      local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,(long)local_a8 + 1);
  }
  if ((pBVar14->module).idToInstruction.
      super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
      super__Vector_impl_data._M_start[scope]->opCode == OpConstant) {
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"gl_Scope","");
    uVar5 = getConstantScalar(pBVar14,scope);
    if (uVar5 < 7) {
      pcVar8 = &DAT_00859a18 + *(int *)(&DAT_00859a18 + (ulong)uVar5 * 4);
    }
    else {
      pcVar8 = "Unknown";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar8,&local_b9);
    p_Var15 = (_Bit_type *)0xf;
    if (local_70 != local_60) {
      p_Var15 = local_60[0];
    }
    if (p_Var15 < (_Bit_type *)(local_48 + (long)local_68)) {
      p_Var15 = (_Bit_type *)0xf;
      if (local_50 != local_40) {
        p_Var15 = local_40[0];
      }
      if (p_Var15 < (_Bit_type *)(local_48 + (long)local_68)) goto LAB_004579a9;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_70);
    }
    else {
LAB_004579a9:
      puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50);
    }
    pp_Var16 = (_Bit_type **)(puVar10 + 2);
    if ((_Bit_type **)*puVar10 == pp_Var16) {
      local_a8 = *pp_Var16;
      uStack_a0 = puVar10[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *pp_Var16;
      local_b8 = (_Bit_type **)*puVar10;
    }
    local_b0 = puVar10[1];
    *puVar10 = pp_Var16;
    puVar10[1] = 0;
    *(undefined1 *)pp_Var16 = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    ppuVar1 = &local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    plVar12 = plVar9 + 2;
    if ((pointer *)*plVar9 == (pointer *)plVar12) {
      local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*plVar12;
      lStack_d0 = plVar9[3];
      local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppuVar1;
    }
    else {
      local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*plVar12;
      local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*plVar9;
    }
    local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)plVar9[1];
    *plVar9 = (long)plVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)local_90,
               (ulong)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    if ((pointer *)
        local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != ppuVar1) {
      operator_delete(local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    pBVar14 = local_98;
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,(long)local_a8 + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,(long)local_40[0] + 1);
    }
    pp_Var16 = local_70;
    if (local_70 != local_60) {
LAB_00457b31:
      operator_delete(pp_Var16,(long)local_60[0] + 1);
    }
  }
  else {
    pcVar8 = makeCooperativeMatrixTypeKHR::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)pBVar14,scope);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,pcVar8,(allocator<char> *)&local_70);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    plVar12 = plVar9 + 2;
    if ((pointer *)*plVar9 == (pointer *)plVar12) {
      local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*plVar12;
      lStack_d0 = plVar9[3];
      local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppuVar1;
    }
    else {
      local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*plVar12;
      local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*plVar9;
    }
    local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)plVar9[1];
    *plVar9 = (long)plVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)local_90,
               (ulong)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    if ((pointer *)
        local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != ppuVar1) {
      operator_delete(local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    local_60[0] = local_a8;
    pp_Var16 = local_b8;
    if (local_b8 != &local_a8) goto LAB_00457b31;
  }
  pcVar8 = makeCooperativeMatrixTypeKHR::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)pBVar14,local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,pcVar8,(allocator<char> *)&local_70);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  ppuVar1 = &local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  plVar12 = plVar9 + 2;
  if ((pointer *)*plVar9 == (pointer *)plVar12) {
    local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar12;
    lStack_d0 = plVar9[3];
    local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar1;
  }
  else {
    local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar12;
    local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*plVar9;
  }
  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)plVar9[1];
  *plVar9 = (long)plVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)local_90,
             (ulong)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  if ((pointer *)
      local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  pBVar14 = local_98;
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,(long)local_a8 + 1);
  }
  pcVar8 = makeCooperativeMatrixTypeKHR::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)pBVar14,local_c4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,pcVar8,(allocator<char> *)&local_70);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  ppuVar1 = &local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  plVar12 = plVar9 + 2;
  if ((pointer *)*plVar9 == (pointer *)plVar12) {
    local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar12;
    lStack_d0 = plVar9[3];
    local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar1;
  }
  else {
    local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar12;
    local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*plVar9;
  }
  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)plVar9[1];
  *plVar9 = (long)plVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)local_90,
             (ulong)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  if ((pointer *)
      local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  pBVar14 = local_98;
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,(long)local_a8 + 1);
  }
  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  IVar4 = makeCompositeDebugType
                    (pBVar14,&local_e8,(char *)local_90[0]._M_head_impl,
                     NonSemanticShaderDebugInfo100Structure,true);
  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,local_f0->resultId);
  pmVar11 = std::
            map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
            ::operator[](&pBVar14->debugId,(key_type_conflict *)&local_e8);
  *pmVar11 = IVar4;
  if (local_90[0]._M_head_impl != (Instruction *)&local_80) {
    operator_delete(local_90[0]._M_head_impl,(long)local_80 + 1);
  }
LAB_00457d17:
  return local_f0->resultId;
}

Assistant:

Id Builder::makeCooperativeMatrixTypeKHR(Id component, Id scope, Id rows, Id cols, Id use)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeCooperativeMatrixKHR].size(); ++t) {
        type = groupedTypes[OpTypeCooperativeMatrixKHR][t];
        if (type->getIdOperand(0) == component &&
            type->getIdOperand(1) == scope &&
            type->getIdOperand(2) == rows &&
            type->getIdOperand(3) == cols &&
            type->getIdOperand(4) == use)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeCooperativeMatrixKHR);
    type->reserveOperands(5);
    type->addIdOperand(component);
    type->addIdOperand(scope);
    type->addIdOperand(rows);
    type->addIdOperand(cols);
    type->addIdOperand(use);
    groupedTypes[OpTypeCooperativeMatrixKHR].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    if (emitNonSemanticShaderDebugInfo)
    {
        // Find a name for one of the parameters. It can either come from debuginfo for another
        // type, or an OpName from a constant.
        auto const findName = [&](Id id) {
            Id id2 = debugId[id];
            for (auto &t : groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeBasic]) {
                if (t->getResultId() == id2) {
                    for (auto &s : strings) {
                        if (s->getResultId() == t->getIdOperand(2)) {
                            return s->getNameString();
                        }
                    }
                }
            }
            for (auto &t : names) {
                if (t->getIdOperand(0) == id) {
                    return t->getNameString();
                }
            }
            return "unknown";
        };
        std::string debugName = "coopmat<";
        debugName += std::string(findName(component)) + ", ";
        if (isConstantScalar(scope)) {
            debugName += std::string("gl_Scope") + std::string(spv::ScopeToString((spv::Scope)getConstantScalar(scope))) + ", ";
        } else {
            debugName += std::string(findName(scope)) + ", ";
        }
        debugName += std::string(findName(rows)) + ", ";
        debugName += std::string(findName(cols)) + ">";
        // There's no nonsemantic debug info instruction for cooperative matrix types,
        // use opaque composite instead.
        auto const debugResultId = makeCompositeDebugType({}, debugName.c_str(), NonSemanticShaderDebugInfo100Structure, true);
        debugId[type->getResultId()] = debugResultId;
    }

    return type->getResultId();
}